

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_r.c
# Opt level: O0

void test_option_r(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int iVar3;
  char *pcVar4;
  char *__s;
  char *file;
  ulong uVar5;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  wchar_t in_stack_00000014;
  char *in_stack_00000018;
  int i;
  int r;
  size_t buff_size_rounded;
  size_t s;
  size_t buff_size;
  char *p1;
  char *p0;
  char *buff;
  char *in_stack_00000458;
  wchar_t in_stack_00000464;
  char *in_stack_00000468;
  void *pvVar6;
  char *in_stack_ffffffffffffffb0;
  char *pcVar7;
  char *e1;
  longlong in_stack_ffffffffffffffb8;
  longlong lVar8;
  char *file_00;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar9;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  void *extra;
  char *in_stack_ffffffffffffffe8;
  wchar_t s_00;
  void *in_stack_fffffffffffffff8;
  
  extra = (void *)0x88b8;
  assertion_make_file(in_stack_ffffffffffffffe8,L'\0',in_stack_ffffffffffffffd8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                      (wchar_t)in_stack_ffffffffffffffd0,
                      (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  wVar1 = systemf("%s cf archive.tar --format=ustar f1 >step1.out 2>step1.err",testprog);
  failure("Error invoking %s cf archive.tar f1",testprog);
  pvVar6 = (void *)0x0;
  assertion_equal_int((char *)CONCAT44(wVar1,in_stack_ffffffffffffffc8),
                      (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_stack_ffffffffffffffb8,
                      in_stack_ffffffffffffffb0,0,(char *)0x11495c,extra);
  assertion_empty_file(in_stack_00000468,in_stack_00000464,in_stack_00000458);
  assertion_empty_file(in_stack_00000468,in_stack_00000464,in_stack_00000458);
  pcVar4 = slurpfile((size_t *)&stack0xffffffffffffffd8,"archive.tar");
  wVar2 = assertion_assert(in_stack_ffffffffffffffc0,
                           (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                           (wchar_t)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,pvVar6);
  if (wVar2 != L'\0') {
    wVar2 = assertion_assert(in_stack_ffffffffffffffc0,
                             (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                             (wchar_t)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,pvVar6);
    if (wVar2 == L'\0') {
      free(pcVar4);
    }
    else {
      assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                          (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffff8
                          ,pcVar4,s,(char *)buff_size,p1);
      assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                          (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffff8
                          ,pcVar4,s,(char *)buff_size,p1);
      assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                          (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffff8
                          ,pcVar4,s,(char *)buff_size,p1);
      pvVar6 = (void *)0x8;
      pcVar7 = "8";
      lVar8 = 0;
      assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                          (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_stack_fffffffffffffff8
                          ,pcVar4,s,(char *)buff_size,p1);
      __s = (char *)malloc((size_t)extra);
      assertion_assert(in_stack_ffffffffffffffc0,(wchar_t)((ulong)lVar8 >> 0x20),(wchar_t)lVar8,
                       pcVar7,pvVar6);
      if (__s == (char *)0x0) {
        free(pcVar4);
      }
      else {
        for (iVar9 = 0; iVar9 < (int)extra; iVar9 = iVar9 + 1) {
          iVar3 = rand();
          __s[iVar9] = "abcdefghijklmnopqrstuvwxyz"[iVar3 % 0x1a];
        }
        __s[(long)extra + -1] = '\0';
        assertion_make_file(in_stack_ffffffffffffffe8,(wchar_t)((ulong)extra >> 0x20),
                            in_stack_ffffffffffffffd8,
                            (wchar_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                            (wchar_t)in_stack_ffffffffffffffd0,(void *)CONCAT44(wVar1,iVar9));
        wVar1 = systemf("%s rf archive.tar --format=ustar f1 >step2.out 2>step2.err",testprog);
        failure("Error invoking %s rf archive.tar f1",testprog);
        pvVar6 = (void *)0x0;
        assertion_equal_int((char *)CONCAT44(wVar1,iVar9),
                            (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),lVar8,pcVar7,0,
                            (char *)0x114c95,extra);
        assertion_empty_file(in_stack_00000468,in_stack_00000464,in_stack_00000458);
        assertion_empty_file(in_stack_00000468,in_stack_00000464,in_stack_00000458);
        file = slurpfile((size_t *)&stack0xffffffffffffffd8,"archive.tar");
        wVar2 = assertion_assert(in_stack_ffffffffffffffc0,(wchar_t)((ulong)lVar8 >> 0x20),
                                 (wchar_t)lVar8,pcVar7,pvVar6);
        if (wVar2 == L'\0') {
          free(pcVar4);
        }
        else {
          uVar5 = (long)extra + 0x1ffU & 0xfffffffffffffe00;
          assertion_assert(in_stack_ffffffffffffffc0,(wchar_t)((ulong)lVar8 >> 0x20),(wchar_t)lVar8,
                           pcVar7,pvVar6);
          assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                              (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),__s,pcVar4,s,
                              (char *)buff_size,p1);
          assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                              (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),__s,pcVar4,s,
                              (char *)buff_size,p1);
          assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                              (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),__s,pcVar4,s,
                              (char *)buff_size,p1);
          assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                              (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),__s,pcVar4,s,
                              (char *)buff_size,p1);
          pcVar7 = "8";
          lVar8 = 0;
          assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                              (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),__s,pcVar4,s,
                              (char *)buff_size,p1);
          free(pcVar4);
          assertion_make_file(file,(wchar_t)((ulong)extra >> 0x20),in_stack_ffffffffffffffd8,
                              (wchar_t)(uVar5 >> 0x20),(wchar_t)uVar5,(void *)CONCAT44(wVar1,iVar9))
          ;
          wVar1 = systemf("%s rf archive.tar --format=ustar f2 >step3.out 2>step3.err",testprog);
          failure("Error invoking %s rf archive.tar f2",testprog);
          pvVar6 = (void *)0x0;
          assertion_equal_int((char *)CONCAT44(wVar1,iVar9),
                              (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),lVar8,pcVar7,0,
                              (char *)0x114fa6,extra);
          assertion_empty_file(in_stack_00000468,in_stack_00000464,in_stack_00000458);
          assertion_empty_file(in_stack_00000468,in_stack_00000464,in_stack_00000458);
          pcVar4 = slurpfile((size_t *)&stack0xffffffffffffffd8,"archive.tar");
          wVar1 = assertion_assert(in_stack_ffffffffffffffc0,(wchar_t)((ulong)lVar8 >> 0x20),
                                   (wchar_t)lVar8,pcVar7,pvVar6);
          if (wVar1 == L'\0') {
            free(file);
          }
          else {
            assertion_assert(in_stack_ffffffffffffffc0,(wchar_t)((ulong)lVar8 >> 0x20),
                             (wchar_t)lVar8,pcVar7,pvVar6);
            wVar2 = (wchar_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
            assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                                (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),__s,file,s,
                                (char *)buff_size,p1);
            assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                                (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),__s,file,s,
                                (char *)buff_size,p1);
            assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                                (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),__s,file,s,
                                (char *)buff_size,p1);
            assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                                (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),__s,file,s,
                                (char *)buff_size,p1);
            pcVar7 = (char *)0x8;
            e1 = "8";
            file_00 = (char *)0x0;
            assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,
                                (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),__s,file,s,
                                (char *)buff_size,p1);
            free(file);
            s_00 = (wchar_t)((ulong)file >> 0x20);
            free(pcVar4);
            assertion_make_dir(file_00,(wchar_t)((ulong)e1 >> 0x20),pcVar7,L'\0');
            assertion_chdir(file_00,(wchar_t)((ulong)e1 >> 0x20),pcVar7);
            wVar1 = systemf("%s xf ../archive.tar >extract.out 2>extract.err",testprog);
            failure("Error invoking %s xf archive.tar",testprog);
            assertion_equal_int((char *)CONCAT44(wVar1,iVar9),wVar2,(longlong)file_00,e1,0,
                                (char *)0x1152c1,extra);
            assertion_empty_file(in_stack_00000468,in_stack_00000464,in_stack_00000458);
            assertion_empty_file(in_stack_00000468,in_stack_00000464,in_stack_00000458);
            strlen(__s);
            assertion_file_contents(in_stack_00000008,unaff_retaddr_00,__s,s_00,pcVar4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_r)
{
	char *buff;
	char *p0, *p1;
	size_t buff_size = 35000;
	size_t s, buff_size_rounded;
	int r, i;

	/* Create an archive with one file. */
	assertMakeFile("f1", 0644, "abc");
	r = systemf("%s cf archive.tar --format=ustar f1 >step1.out 2>step1.err", testprog);
	failure("Error invoking %s cf archive.tar f1", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("step1.out");
	assertEmptyFile("step1.err");

	/* Do some basic validation of the constructed archive. */
	p0 = slurpfile(&s, "archive.tar");
	if (!assert(p0 != NULL))
		return;
	if (!assert(s >= 2048)) {
		free(p0);
		return;
	}
	assertEqualMem(p0 + 0, "f1", 3);
	assertEqualMem(p0 + 512, "abc", 3);
	assertEqualMem(p0 + 1024, "\0\0\0\0\0\0\0\0", 8);
	assertEqualMem(p0 + 1536, "\0\0\0\0\0\0\0\0", 8);

	/* Edit that file with a lot more data and update the archive with a new copy. */
	buff = malloc(buff_size);
	assert(buff != NULL);
	if (buff == NULL) {
		free(p0);
		return;
	}

	for (i = 0; i < (int)buff_size; ++i)
		buff[i] = "abcdefghijklmnopqrstuvwxyz"[rand() % 26];
	buff[buff_size - 1] = '\0';
	assertMakeFile("f1", 0644, buff);
	r = systemf("%s rf archive.tar --format=ustar f1 >step2.out 2>step2.err", testprog);
	failure("Error invoking %s rf archive.tar f1", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("step2.out");
	assertEmptyFile("step2.err");

	/* The constructed archive should just have the new entry appended. */
	p1 = slurpfile(&s, "archive.tar");
	if (!assert(p1 != NULL)) {
		free(p0);
		return;
	}
	buff_size_rounded = ((buff_size + 511) / 512) * 512;
	assert(s >= 2560 + buff_size_rounded);
	/* Verify first entry is unchanged. */
	assertEqualMem(p0, p1, 1024);
	/* Verify that second entry is correct. */
	assertEqualMem(p1 + 1024, "f1", 3);
	assertEqualMem(p1 + 1536, buff, buff_size);
	/* Verify end-of-archive marker. */
	assertEqualMem(p1 + 1536 + buff_size_rounded, "\0\0\0\0\0\0\0\0", 8);
	assertEqualMem(p1 + 2048 + buff_size_rounded, "\0\0\0\0\0\0\0\0", 8);

	free(p0);
	p0 = p1;

	/* Update the archive by adding a different file. */
	assertMakeFile("f2", 0644, "f2");
	r = systemf("%s rf archive.tar --format=ustar f2 >step3.out 2>step3.err", testprog);
	failure("Error invoking %s rf archive.tar f2", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("step3.out");
	assertEmptyFile("step3.err");

	/* Validate the constructed archive. */
	p1 = slurpfile(&s, "archive.tar");
	if (!assert(p1 != NULL)) {
		free(p0);
		return;
	}
	assert(s >= 3584 + buff_size_rounded);
	/* Verify first two entries are unchanged. */
	assertEqualMem(p0, p1, 1536 + buff_size_rounded);
	/* Verify that new entry is correct. */
	assertEqualMem(p1 + 1536 + buff_size_rounded, "f2", 3);
	assertEqualMem(p1 + 2048 + buff_size_rounded, "f2", 3);
	/* Verify end-of-archive marker. */
	assertEqualMem(p1 + 2560 + buff_size_rounded, "\0\0\0\0\0\0\0\0", 8);
	assertEqualMem(p1 + 3072 + buff_size_rounded, "\0\0\0\0\0\0\0\0", 8);
	free(p0);
	free(p1);

	/* Unpack everything */
	assertMakeDir("extract", 0775);
	assertChdir("extract");
	r = systemf("%s xf ../archive.tar >extract.out 2>extract.err", testprog);
	failure("Error invoking %s xf archive.tar", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("extract.out");
	assertEmptyFile("extract.err");

	/* Verify that the second copy of f1 overwrote the first. */
	assertFileContents(buff, (int)strlen(buff), "f1");
}